

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::UnitTestImpl(UnitTestImpl *this,UnitTest *parent)

{
  DeathTestFactory *p;
  TestEventListeners *this_00;
  UnitTest *in_RSI;
  UnitTestImpl *in_RDI;
  UnitTestImpl *in_stack_ffffffffffffff48;
  TestResult *in_stack_ffffffffffffff50;
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  *listener;
  TestEventListeners *this_01;
  TestPartResultReporterInterface **in_stack_ffffffffffffff68;
  TestEventListeners *in_stack_ffffffffffffff70;
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  *this_02;
  Mutex *in_stack_ffffffffffffff80;
  
  in_RDI->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_002014a8;
  in_RDI->parent_ = in_RSI;
  FilePath::FilePath((FilePath *)in_stack_ffffffffffffff70);
  DefaultGlobalTestPartResultReporter::DefaultGlobalTestPartResultReporter
            ((DefaultGlobalTestPartResultReporter *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  DefaultPerThreadTestPartResultReporter::DefaultPerThreadTestPartResultReporter
            ((DefaultPerThreadTestPartResultReporter *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  in_RDI->global_test_part_result_repoter_ =
       &(in_RDI->default_global_test_part_result_reporter_).super_TestPartResultReporterInterface;
  Mutex::Mutex(in_stack_ffffffffffffff80);
  ThreadLocal<testing::TestPartResultReporterInterface_*>::ThreadLocal
            ((ThreadLocal<testing::TestPartResultReporterInterface_*> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::vector
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)0x18d312);
  std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::vector
            ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)0x18d32b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x18d344);
  ParameterizedTestCaseRegistry::ParameterizedTestCaseRegistry
            ((ParameterizedTestCaseRegistry *)0x18d35d);
  in_RDI->parameterized_tests_registered_ = false;
  in_RDI->last_death_test_case_ = -1;
  in_RDI->current_test_case_ = (TestCase *)0x0;
  in_RDI->current_test_info_ = (TestInfo *)0x0;
  TestResult::TestResult(in_stack_ffffffffffffff50);
  TestEventListeners::TestEventListeners(in_stack_ffffffffffffff70);
  in_RDI->os_stack_trace_getter_ = (OsStackTraceGetterInterface *)0x0;
  in_RDI->post_flag_parse_init_performed_ = false;
  in_RDI->random_seed_ = 0;
  Random::Random(&in_RDI->random_,0);
  in_RDI->start_timestamp_ = 0;
  in_RDI->elapsed_time_ = 0;
  this_02 = (ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
             *)&in_RDI->internal_run_death_test_flag_;
  scoped_ptr<testing::internal::InternalRunDeathTestFlag>::scoped_ptr
            ((scoped_ptr<testing::internal::InternalRunDeathTestFlag> *)this_02,
             (InternalRunDeathTestFlag *)0x0);
  this_01 = (TestEventListeners *)&in_RDI->death_test_factory_;
  p = (DeathTestFactory *)operator_new(8);
  DefaultDeathTestFactory::DefaultDeathTestFactory
            ((DefaultDeathTestFactory *)in_stack_ffffffffffffff50);
  scoped_ptr<testing::internal::DeathTestFactory>::scoped_ptr
            ((scoped_ptr<testing::internal::DeathTestFactory> *)this_01,p);
  listener = &in_RDI->gtest_trace_stack_;
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::ThreadLocal(this_02);
  in_RDI->catch_exceptions_ = false;
  this_00 = listeners(in_RDI);
  operator_new(8);
  PrettyUnitTestResultPrinter::PrettyUnitTestResultPrinter((PrettyUnitTestResultPrinter *)this_00);
  TestEventListeners::SetDefaultResultPrinter(this_01,(TestEventListener *)listener);
  return;
}

Assistant:

UnitTestImpl::UnitTestImpl(UnitTest* parent)
    : parent_(parent),
      GTEST_DISABLE_MSC_WARNINGS_PUSH_(4355 /* using this in initializer */)
      default_global_test_part_result_reporter_(this),
      default_per_thread_test_part_result_reporter_(this),
      GTEST_DISABLE_MSC_WARNINGS_POP_()
      global_test_part_result_repoter_(
          &default_global_test_part_result_reporter_),
      per_thread_test_part_result_reporter_(
          &default_per_thread_test_part_result_reporter_),
      parameterized_test_registry_(),
      parameterized_tests_registered_(false),
      last_death_test_case_(-1),
      current_test_case_(NULL),
      current_test_info_(NULL),
      ad_hoc_test_result_(),
      os_stack_trace_getter_(NULL),
      post_flag_parse_init_performed_(false),
      random_seed_(0),  // Will be overridden by the flag before first use.
      random_(0),  // Will be reseeded before first use.
      start_timestamp_(0),
      elapsed_time_(0),
#if GTEST_HAS_DEATH_TEST
      death_test_factory_(new DefaultDeathTestFactory),
#endif
      // Will be overridden by the flag before first use.
      catch_exceptions_(false) {
  listeners()->SetDefaultResultPrinter(new PrettyUnitTestResultPrinter);
}